

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool read_input_content(string *filename,string *input)

{
  bool bVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __first_00;
  string msg;
  ifstream f;
  int aiStack_200 [50];
  undefined8 auStack_138 [36];
  
  bVar1 = std::operator==(filename,"-");
  if (bVar1) {
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)(*(long *)(std::cin + -0x18) + 0x232540);
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)input,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
LAB_0015c30b:
    bVar1 = true;
  }
  else {
    std::ifstream::ifstream((string *)&f);
    std::ifstream::open((string *)&f,(_Ios_Openmode)filename);
    if (*(int *)((long)aiStack_200 + *(long *)(_f + -0x18)) == 0) {
      __first_00._8_8_ = 0xffffffffffffffff;
      __first_00._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(_f + -0x18));
      std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((string *)input,__first_00,
                 (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
      if (*(int *)((long)aiStack_200 + *(long *)(_f + -0x18)) == 0) {
        std::ifstream::~ifstream(&f);
        goto LAB_0015c30b;
      }
      std::operator+(&msg,"Reading input file: ",filename);
    }
    else {
      std::operator+(&msg,"Opening input file: ",filename);
    }
    perror(msg._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&msg);
    std::ifstream::~ifstream(&f);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool read_input_content(std::string filename, std::string *input)
{
    // Input file "-" tells Jsonnet to read stdin.
    if (filename == "-") {
        input->assign(std::istreambuf_iterator<char>(std::cin), std::istreambuf_iterator<char>());
    } else {
        std::ifstream f;
        f.open(filename);
        if (!f.good()) {
            std::string msg = "Opening input file: " + filename;
            perror(msg.c_str());
            return false;
        }
        input->assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());
        if (!f.good()) {
            std::string msg = "Reading input file: " + filename;
            perror(msg.c_str());
            return false;
        }
    }
    return true;
}